

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AlterTableInfo::Deserialize(AlterTableInfo *this,Deserializer *deserializer)

{
  AlterTableType AVar1;
  SerializationException *this_00;
  allocator local_41;
  _Alloc_hider local_40;
  
  AVar1 = Deserializer::ReadProperty<duckdb::AlterTableType>(deserializer,300,"alter_table_type");
  switch(AVar1) {
  case RENAME_COLUMN:
    RenameColumnInfo::Deserialize((RenameColumnInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case RENAME_TABLE:
    RenameTableInfo::Deserialize((RenameTableInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case ADD_COLUMN:
    AddColumnInfo::Deserialize((AddColumnInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case REMOVE_COLUMN:
    RemoveColumnInfo::Deserialize((RemoveColumnInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case ALTER_COLUMN_TYPE:
    ChangeColumnTypeInfo::Deserialize((ChangeColumnTypeInfo *)&stack0xffffffffffffffc0,deserializer)
    ;
    break;
  case SET_DEFAULT:
    SetDefaultInfo::Deserialize((SetDefaultInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case FOREIGN_KEY_CONSTRAINT:
    AlterForeignKeyInfo::Deserialize((AlterForeignKeyInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case SET_NOT_NULL:
    SetNotNullInfo::Deserialize((SetNotNullInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case DROP_NOT_NULL:
    DropNotNullInfo::Deserialize((DropNotNullInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc0,
               "Unsupported type for deserialization of AlterTableInfo!",&local_41);
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffc0);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case ADD_CONSTRAINT:
    AddConstraintInfo::Deserialize((AddConstraintInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case SET_PARTITIONED_BY:
    SetPartitionedByInfo::Deserialize((SetPartitionedByInfo *)&stack0xffffffffffffffc0,deserializer)
    ;
    break;
  case SET_SORTED_BY:
    SetSortedByInfo::Deserialize((SetSortedByInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case ADD_FIELD:
    AddFieldInfo::Deserialize((AddFieldInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case REMOVE_FIELD:
    RemoveFieldInfo::Deserialize((RemoveFieldInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case RENAME_FIELD:
    RenameFieldInfo::Deserialize((RenameFieldInfo *)&stack0xffffffffffffffc0,deserializer);
  }
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_40._M_p;
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> AlterTableInfo::Deserialize(Deserializer &deserializer) {
	auto alter_table_type = deserializer.ReadProperty<AlterTableType>(300, "alter_table_type");
	unique_ptr<AlterTableInfo> result;
	switch (alter_table_type) {
	case AlterTableType::ADD_COLUMN:
		result = AddColumnInfo::Deserialize(deserializer);
		break;
	case AlterTableType::ADD_CONSTRAINT:
		result = AddConstraintInfo::Deserialize(deserializer);
		break;
	case AlterTableType::ADD_FIELD:
		result = AddFieldInfo::Deserialize(deserializer);
		break;
	case AlterTableType::ALTER_COLUMN_TYPE:
		result = ChangeColumnTypeInfo::Deserialize(deserializer);
		break;
	case AlterTableType::DROP_NOT_NULL:
		result = DropNotNullInfo::Deserialize(deserializer);
		break;
	case AlterTableType::FOREIGN_KEY_CONSTRAINT:
		result = AlterForeignKeyInfo::Deserialize(deserializer);
		break;
	case AlterTableType::REMOVE_COLUMN:
		result = RemoveColumnInfo::Deserialize(deserializer);
		break;
	case AlterTableType::REMOVE_FIELD:
		result = RemoveFieldInfo::Deserialize(deserializer);
		break;
	case AlterTableType::RENAME_COLUMN:
		result = RenameColumnInfo::Deserialize(deserializer);
		break;
	case AlterTableType::RENAME_FIELD:
		result = RenameFieldInfo::Deserialize(deserializer);
		break;
	case AlterTableType::RENAME_TABLE:
		result = RenameTableInfo::Deserialize(deserializer);
		break;
	case AlterTableType::SET_DEFAULT:
		result = SetDefaultInfo::Deserialize(deserializer);
		break;
	case AlterTableType::SET_NOT_NULL:
		result = SetNotNullInfo::Deserialize(deserializer);
		break;
	case AlterTableType::SET_PARTITIONED_BY:
		result = SetPartitionedByInfo::Deserialize(deserializer);
		break;
	case AlterTableType::SET_SORTED_BY:
		result = SetSortedByInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of AlterTableInfo!");
	}
	return std::move(result);
}